

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

SharedPtr __thiscall
deqp::gles31::Functional::anon_unknown_0::generateRandomShaderSet
          (anon_unknown_0 *this,Random *rnd,GLSLVersion glslVersion,bool onlyExtensionStages)

{
  bool bVar1;
  bool bVar2;
  deUint32 dVar3;
  Program *pPVar4;
  ShaderSet *pSVar5;
  Shader *pSVar6;
  undefined7 in_register_00000009;
  ShaderType type;
  SharedPtrStateBase *extraout_RDX;
  float fVar7;
  SharedPtr SVar8;
  SharedPtr program;
  
  fVar7 = deRandom_getFloat(&rnd->m_rnd);
  if ((int)CONCAT71(in_register_00000009,onlyExtensionStages) == 0) {
    if (0.5 <= fVar7) {
      fVar7 = deRandom_getFloat(&rnd->m_rnd);
      if (0.5 <= fVar7) {
        pPVar4 = (Program *)operator_new(0x28);
        ResourceDefinition::Program::Program(pPVar4,true);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&program,(Node *)pPVar4);
        bVar1 = de::Random::getBool(rnd);
        pSVar6 = (Shader *)operator_new(0x28);
        ResourceDefinition::Shader::Shader(pSVar6,&program,(uint)!bVar1,glslVersion);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)this,(Node *)pSVar6);
      }
      else {
        pPVar4 = (Program *)operator_new(0x28);
        ResourceDefinition::Program::Program(pPVar4,false);
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr(&program,(Node *)pPVar4);
        pSVar5 = (ShaderSet *)operator_new(0x30);
        ResourceDefinition::ShaderSet::ShaderSet(pSVar5,&program,glslVersion);
        bVar1 = de::Random::getBool(rnd);
        if (bVar1) {
          pSVar5->m_stagePresent[0] = true;
          pSVar5->m_stageReferencing[0] = true;
          bVar1 = de::Random::getBool(rnd);
        }
        else {
          bVar1 = de::Random::getBool(rnd);
          pSVar5->m_stagePresent[0] = true;
          pSVar5->m_stageReferencing[0] = bVar1;
          bVar1 = true;
        }
        pSVar5->m_stagePresent[1] = true;
        pSVar5->m_stageReferencing[1] = bVar1;
        de::
        SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
        SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)this,(Node *)pSVar5);
      }
    }
    else {
      pPVar4 = (Program *)operator_new(0x28);
      ResourceDefinition::Program::Program(pPVar4,false);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr(&program,(Node *)pPVar4);
      pSVar6 = (Shader *)operator_new(0x28);
      ResourceDefinition::Shader::Shader(pSVar6,&program,SHADERTYPE_COMPUTE,glslVersion);
      de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
      ::SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
                   *)this,(Node *)pSVar6);
    }
    goto LAB_004fcbe7;
  }
  if (0.5 <= fVar7) {
    pPVar4 = (Program *)operator_new(0x28);
    ResourceDefinition::Program::Program(pPVar4,true);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr(&program,(Node *)pPVar4);
    dVar3 = deRandom_getUint32(&rnd->m_rnd);
    pSVar6 = (Shader *)operator_new(0x28);
    type = SHADERTYPE_GEOMETRY;
    if (dVar3 % 3 != 0) {
      type = (dVar3 % 3 != 1) + SHADERTYPE_TESSELLATION_CONTROL;
    }
    ResourceDefinition::Shader::Shader(pSVar6,&program,type,glslVersion);
    de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
    SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
               *)this,(Node *)pSVar6);
    goto LAB_004fcbe7;
  }
  pPVar4 = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(pPVar4,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&program,(Node *)pPVar4);
  pSVar5 = (ShaderSet *)operator_new(0x30);
  ResourceDefinition::ShaderSet::ShaderSet(pSVar5,&program,glslVersion);
  bVar1 = de::Random::getBool(rnd);
  pSVar5->m_stagePresent[0] = true;
  pSVar5->m_stageReferencing[0] = bVar1;
  bVar1 = de::Random::getBool(rnd);
  pSVar5->m_stagePresent[1] = true;
  pSVar5->m_stageReferencing[1] = bVar1;
  bVar1 = de::Random::getBool(rnd);
  if (bVar1) {
    pSVar5->m_stagePresent[2] = true;
    pSVar5->m_stageReferencing[2] = true;
    bVar1 = de::Random::getBool(rnd);
    if (bVar1) {
      bVar2 = de::Random::getBool(rnd);
LAB_004fcb84:
      pSVar5->m_stagePresent[3] = true;
      pSVar5->m_stageReferencing[3] = bVar2;
      bVar1 = de::Random::getBool(rnd);
      goto LAB_004fcbd3;
    }
  }
  else {
    bVar1 = de::Random::getBool(rnd);
    pSVar5->m_stagePresent[2] = true;
    pSVar5->m_stageReferencing[2] = bVar1;
    bVar1 = de::Random::getBool(rnd);
    bVar2 = true;
    if (bVar1) goto LAB_004fcb84;
    bVar1 = de::Random::getBool(rnd);
    pSVar5->m_stagePresent[3] = true;
    pSVar5->m_stageReferencing[3] = bVar1;
    bVar1 = true;
LAB_004fcbd3:
    pSVar5->m_stagePresent[4] = true;
    pSVar5->m_stageReferencing[4] = bVar1;
  }
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)this,(Node *)pSVar5);
LAB_004fcbe7:
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&program);
  SVar8.m_state = extraout_RDX;
  SVar8.m_ptr = (Node *)this;
  return SVar8;
}

Assistant:

static ResourceDefinition::Node::SharedPtr generateRandomShaderSet (de::Random& rnd, glu::GLSLVersion glslVersion, bool onlyExtensionStages)
{
	if (!onlyExtensionStages)
		return generateRandomCoreShaderSet(rnd, glslVersion);
	else
		return generateRandomExtShaderSet(rnd, glslVersion);
}